

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O0

void __thiscall wabt::TypeChecker::PrintStackIfFailed<>(TypeChecker *this,Result result,char *desc)

{
  char *desc_00;
  bool bVar1;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  Result local_28;
  Enum local_24;
  char *local_20;
  char *desc_local;
  TypeChecker *this_local;
  Result result_local;
  
  local_24 = result.enum_;
  local_20 = desc;
  desc_local = (char *)this;
  this_local._4_4_ = result.enum_;
  bVar1 = Failed(result);
  desc_00 = local_20;
  if (bVar1) {
    local_28.enum_ = this_local._4_4_;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48);
    PrintStackIfFailed(this,local_28,desc_00,&local_48);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_48);
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Minor optimzation, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailed(result, desc, {args...});
    }
  }